

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O3

char * SimpleString::StrNCpy(char *s1,char *s2,size_t n)

{
  char cVar1;
  char *result;
  size_t sVar2;
  
  if (n != 0 && s1 != (char *)0x0) {
    cVar1 = *s2;
    *s1 = cVar1;
    if (n != 1) {
      sVar2 = 1;
      do {
        if (cVar1 == '\0') {
          return s1;
        }
        cVar1 = s2[sVar2];
        s1[sVar2] = cVar1;
        sVar2 = sVar2 + 1;
      } while (n != sVar2);
    }
  }
  return s1;
}

Assistant:

char* SimpleString::StrNCpy(char* s1, const char* s2, size_t n)
{
    char* result = s1;

    if((NULLPTR == s1) || (0 == n)) return result;

    *s1 = *s2;
    while ((--n != 0) && *s1){
        *++s1 = *++s2;
    }
    return result;
}